

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void NetUpdate(void)

{
  BYTE *__src;
  SWORD SVar1;
  int iVar2;
  DBot *pDVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  size_t __n;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  usercmd_t *basis;
  ticcmd_t *basis_00;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int *piVar22;
  DBot **ppDVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  ulong uStack_90;
  BYTE *cmddata;
  int local_70;
  uint local_6c;
  ulong local_68;
  uint local_60;
  int local_5c;
  ulong local_58;
  uint local_4c;
  DBot **local_48;
  ulong local_40;
  BYTE playerbytes [8];
  
  if (GC::Threshold <= GC::AllocBytes) {
    GC::Step();
  }
  iVar24 = nettics[0];
  iVar2 = resendto[0];
  if (ticdup != 0) {
    iVar12 = 0;
    iVar2 = (*I_GetTime)(false);
    iVar24 = iVar2 - gametime;
    if (iVar24 == 0 || iVar2 < gametime) {
      gametime = iVar2;
      GetPackets();
      return;
    }
    local_58 = CONCAT44(local_58._4_4_,skiptics);
    iVar6 = skiptics - iVar24;
    bVar26 = skiptics < iVar24;
    skiptics = iVar6;
    if (iVar6 == 0 || bVar26) {
      skiptics = 0;
    }
    local_6c = -iVar6;
    local_68 = CONCAT44(local_68._4_4_,iVar24);
    gametime = iVar2;
    for (; ((int)local_58 <= iVar24 && (iVar12 < (int)local_6c)); iVar12 = iVar12 + 1) {
      I_StartTic();
      D_ProcessEvents();
      if ((pauseext != false) || (0x10 < (maketic - gametic) / ticdup)) break;
      G_BuildTiccmd(localcmds + maketic % 0xb4);
      iVar2 = maketic + 1;
      if (ticdup == 1 || iVar2 == 0) {
LAB_00388144:
        maketic = iVar2;
        Net_NewMakeTic();
      }
      else {
        iVar6 = iVar2 % ticdup;
        if (iVar6 == 0) {
          iVar7 = iVar2 - ticdup;
          iVar6 = 0;
          iVar20 = 0;
          if (0 < ticdup) {
            iVar20 = ticdup;
          }
          iVar19 = 0;
          iVar18 = 0;
          iVar17 = 0;
          iVar16 = 0;
          iVar14 = 0;
          iVar9 = iVar7;
          iVar24 = iVar20;
          while (bVar26 = iVar24 != 0, iVar24 = iVar24 + -1, bVar26) {
            iVar8 = iVar9 % 0xb4;
            iVar6 = iVar6 + localcmds[iVar8].ucmd.pitch;
            iVar19 = iVar19 + localcmds[iVar8].ucmd.yaw;
            iVar18 = iVar18 + localcmds[iVar8].ucmd.roll;
            iVar17 = iVar17 + localcmds[iVar8].ucmd.forwardmove;
            iVar16 = iVar16 + localcmds[iVar8].ucmd.sidemove;
            iVar14 = iVar14 + localcmds[iVar8].ucmd.upmove;
            iVar9 = iVar9 + 1;
          }
          iVar6 = iVar6 / ticdup;
          iVar19 = iVar19 / ticdup;
          iVar18 = iVar18 / ticdup;
          iVar17 = iVar17 / ticdup;
          iVar16 = iVar16 / ticdup;
          iVar14 = iVar14 / ticdup;
          maketic = iVar2;
          while (bVar26 = iVar20 != 0, iVar20 = iVar20 + -1, iVar24 = (int)local_68, iVar2 = maketic
                , bVar26) {
            iVar24 = iVar7 % 0xb4;
            localcmds[iVar24].ucmd.pitch = (short)iVar6;
            localcmds[iVar24].ucmd.yaw = (short)iVar19;
            localcmds[iVar24].ucmd.roll = (short)iVar18;
            localcmds[iVar24].ucmd.forwardmove = (short)iVar17;
            localcmds[iVar24].ucmd.sidemove = (short)iVar16;
            localcmds[iVar24].ucmd.upmove = (short)iVar14;
            iVar7 = iVar7 + 1;
          }
          goto LAB_00388144;
        }
        iVar20 = maketic;
        maketic = iVar2;
        while (iVar2 - iVar6 < iVar20) {
          localcmds[(iVar20 + -1) % 0xb4].ucmd.buttons =
               localcmds[(iVar20 + -1) % 0xb4].ucmd.buttons | localcmds[iVar20 % 0xb4].ucmd.buttons;
          iVar20 = iVar20 + -1;
        }
      }
    }
    iVar24 = nettics[0];
    iVar2 = resendto[0];
    if ((singletics == false) &&
       (iVar6 = maketic / ticdup, iVar24 = iVar6, iVar2 = iVar6, demoplayback != true)) {
      uVar4 = (long)(maketic - iVar12) / (long)ticdup;
      uVar21 = uVar4 & 0xffffffff;
      local_60 = 1;
      local_70 = 0;
      if ((consoleplayer == Net_Arbitrator) && (local_70 = 0, NetMode == '\x01')) {
        ppDVar23 = (DBot **)&DAT_017dc118;
        iVar24 = 1;
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          if (playeringame[lVar10] == true) {
            pDVar3 = GC::ReadBarrier<DBot>(ppDVar23);
            iVar24 = iVar24 + (uint)(pDVar3 == (DBot *)0x0);
          }
          ppDVar23 = ppDVar23 + 0x54;
        }
        iVar24 = iVar24 + -2;
        piVar11 = playerfornode;
        iVar2 = 0;
        SVar1 = doomcom.numnodes;
        for (lVar10 = 0; lVar10 < SVar1; lVar10 = lVar10 + 1) {
          if (nodejustleft[lVar10] == true) {
            if (iVar24 == 0) {
              PlayerIsGone((int)lVar10,*piVar11);
              SVar1 = doomcom.numnodes;
            }
            else {
              iVar2 = iVar2 + 1;
            }
          }
          piVar11 = piVar11 + 1;
        }
        local_60 = iVar24 + (uint)(iVar24 == 0);
        local_70 = iVar2;
      }
      local_40 = 0;
      if (0 < (int)local_60) {
        local_40 = (ulong)local_60;
      }
      local_48 = (DBot **)&DAT_017dc118;
      uVar25 = 0;
      local_4c = (uint)uVar4;
      while( true ) {
        iVar12 = (int)uVar21;
        if ((long)doomcom.numnodes <= (long)uVar25) break;
        if (((nodeingame[uVar25] == true) &&
            ((((NetMode != '\x01' || (consoleplayer == Net_Arbitrator)) || (uVar25 == 0)) ||
             (uVar25 == (uint)nodeforplayer[Net_Arbitrator])))) &&
           ((((iVar6 != iVar12 || (0 < resendcount[uVar25])) || (remoteresend[uVar25] != false)) ||
            (nettics[uVar25] == 0)))) {
          uVar4 = (long)maketic / (long)ticdup;
          piVar11 = (int *)((long)maketic % (long)ticdup & 0xffffffff);
          piVar22 = (int *)(uVar4 & 0xffffffff);
          iVar24 = (int)uVar4;
          doomcom.data[0] = '\0';
          local_5c = resendto[uVar25];
          doomcom.data[1] = (BYTE)local_5c;
          if (((NetMode == '\x01') && (uVar25 != 0)) &&
             (piVar11 = &consoleplayer, consoleplayer == Net_Arbitrator)) {
            for (uVar4 = 1; iVar24 = (int)piVar22, (long)uVar4 < (long)doomcom.numnodes;
                uVar4 = uVar4 + 1) {
              if (nodeingame[uVar4] == true) {
                piVar11 = (int *)(ulong)(uint)nettics[uVar4];
                if (iVar24 <= nettics[uVar4]) {
                  piVar11 = piVar22;
                }
                if (uVar25 != uVar4) {
                  piVar22 = piVar11;
                }
              }
            }
            doomcom.data[2] = (BYTE)piVar22;
            uStack_90 = 3;
          }
          else {
            uStack_90 = 2;
          }
          uVar13 = iVar24 - local_5c;
          local_68 = 0;
          if (0 < (int)uVar13) {
            local_68 = (ulong)uVar13;
          }
          if (0x24 < (int)uVar13) {
            I_Error("NetUpdate: Node %d missed too many tics",uVar25,piVar11);
          }
          if (net_extratic.Value == 2) {
            iVar24 = nettics[uVar25];
          }
          else if (net_extratic.Value == 1) {
            if (iVar24 < 2) {
              iVar24 = 1;
            }
            iVar24 = iVar24 + -1;
          }
          resendto[uVar25] = iVar24;
          if (((0 < (int)uVar13 || iVar6 != iVar12) || ((remoteresend[uVar25] & 1U) != 0)) ||
             (nettics[uVar25] == 0)) {
            uVar4 = uStack_90;
            if ((remoteresend[uVar25] & 1U) != 0) {
              doomcom.data[0] = doomcom.data[0] | 0x40;
              uVar4 = (ulong)((int)uStack_90 + 1);
              doomcom.data[uStack_90] = (BYTE)nettics[uVar25];
            }
            bVar5 = (byte)local_68;
            if (2 < (int)uVar13) {
              doomcom.data[uVar4] = bVar5 - 3;
              bVar5 = 3;
              uVar4 = (ulong)((int)uVar4 + 1);
            }
            iVar24 = (int)uVar4;
            doomcom.data[0] = doomcom.data[0] | bVar5;
            if (0 < local_70) {
              doomcom.data[0] = doomcom.data[0] | 8;
              iVar24 = iVar24 + 1;
              doomcom.data[uVar4] = (BYTE)local_70;
              piVar11 = playerfornode;
              SVar1 = doomcom.numnodes;
              for (lVar10 = 0; lVar10 < SVar1; lVar10 = lVar10 + 1) {
                if (nodejustleft[lVar10] == true) {
                  lVar15 = (long)iVar24;
                  iVar24 = iVar24 + 1;
                  doomcom.data[lVar15] = (BYTE)*piVar11;
                  SVar1 = doomcom.numnodes;
                }
                piVar11 = piVar11 + 1;
              }
            }
            doomcom.data[iVar24] = (BYTE)((maketic - (gametic + (int)local_68)) / ticdup);
            iVar2 = iVar24 + 1;
            if (0 < (int)uVar13) {
              if ((uVar25 != 0 && 1 < (int)local_60) && (consoleplayer == Net_Arbitrator)) {
                doomcom.data[0] = doomcom.data[0] | 0x10;
                iVar2 = iVar24 + 2;
                doomcom.data[(long)iVar24 + 1] = (BYTE)local_60;
                if (NetMode == '\x01') {
                  iVar24 = 1;
                  ppDVar23 = local_48;
                  for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
                    if (((playeringame[uVar4] == true) &&
                        (pDVar3 = GC::ReadBarrier<DBot>(ppDVar23), pDVar3 == (DBot *)0x0)) &&
                       ((uVar4 != (uint)playerfornode[uVar25] && (uVar4 != (uint)consoleplayer)))) {
                      lVar10 = (long)iVar24;
                      iVar24 = iVar24 + 1;
                      playerbytes[lVar10] = (BYTE)uVar4;
                      lVar10 = (long)iVar2;
                      iVar2 = iVar2 + 1;
                      doomcom.data[lVar10] = (BYTE)uVar4;
                    }
                    ppDVar23 = ppDVar23 + 0x54;
                  }
                }
              }
              cmddata = doomcom.data + iVar2;
              for (uVar4 = 0; uVar4 != local_40; uVar4 = uVar4 + 1) {
                uVar21 = local_68 & 0xffffffff;
                iVar24 = local_5c;
                local_58 = uVar4;
                while (iVar2 = (int)uVar21, uVar21 = (ulong)(iVar2 - 1), iVar2 != 0) {
                  iVar2 = (ticdup * (iVar24 + -1)) % 0xb4;
                  iVar12 = iVar24 % 0x24;
                  if (uVar4 == 0) {
                    iVar20 = (ticdup * iVar24) % 0xb4;
                    WriteWord(localcmds[iVar20].consistancy,&cmddata);
                    if (specials.used[iVar12] != 0) {
                      memcpy(cmddata,specials.streams[iVar12],specials.used[iVar12]);
                      cmddata = cmddata + specials.used[iVar12];
                    }
                    basis_00 = localcmds + iVar2;
                    if (iVar2 < 0) {
                      basis_00 = (ticcmd_t *)0x0;
                    }
                    WriteUserCmdMessage(&localcmds[iVar20].ucmd,&basis_00->ucmd,&cmddata);
                    uVar4 = local_58;
                  }
                  else if (uVar25 != 0) {
                    bVar5 = playerbytes[uVar4];
                    local_6c = (iVar24 + -1) % 0x24;
                    WriteWord(netcmds[bVar5][iVar12].consistancy,&cmddata);
                    __n = (size_t)NetSpecs[bVar5][iVar12].m_Len;
                    __src = NetSpecs[bVar5][iVar12].m_Data;
                    if (__src != (BYTE *)0x0 && __n != 0) {
                      memcpy(cmddata,__src,__n);
                      cmddata = cmddata + __n;
                    }
                    basis = &netcmds[bVar5][local_6c].ucmd;
                    if ((int)local_6c < 0) {
                      basis = (usercmd_t *)0x0;
                    }
                    WriteUserCmdMessage(&netcmds[bVar5][iVar12].ucmd,basis,&cmddata);
                    uVar4 = local_58;
                  }
                  iVar24 = iVar24 + 1;
                }
              }
              iVar2 = (int)cmddata + -0x17cd9f4;
              uVar21 = (ulong)local_4c;
            }
            HSendPacket((int)uVar25,iVar2);
          }
        }
        uVar25 = uVar25 + 1;
      }
      GetPackets();
      iVar24 = nettics[0];
      iVar2 = resendto[0];
      if ((iVar6 != iVar12) && (consoleplayer != Net_Arbitrator)) {
        if (NetMode == '\0') {
          iVar24 = 0;
          if (net_ticbalance.Value == true) {
            iVar12 = 0;
            iVar2 = 0;
            for (lVar10 = 0; lVar10 != 0x90; lVar10 = lVar10 + 4) {
              iVar2 = iVar2 + *(int *)((long)netdelay[nodeforplayer[Net_Arbitrator]] + lVar10);
              iVar12 = iVar12 + *(int *)((long)netdelay[0] + lVar10);
            }
            iVar2 = iVar2 / 0x24;
            iVar12 = iVar12 / 0x24;
            if (iVar12 < iVar2) {
              iVar24 = (iVar2 + iVar12) / 2;
              lastaverage = iVar24;
            }
            else {
              iVar24 = lastaverage;
              if (0 < lastaverage && iVar2 + 2 < iVar12) {
                iVar24 = lastaverage + -1;
                lastaverage = iVar24;
              }
            }
          }
          mastertics = iVar24 + nettics[nodeforplayer[Net_Arbitrator]];
        }
        if ((nettics[0] <= mastertics) && (gametime = gametime + -1, debugfile != (FILE *)0x0)) {
          fputc(0x2d,(FILE *)debugfile);
        }
        bVar26 = 3 < oldnettics - mastertics;
        if (NetMode != '\x01') {
          bVar26 = mastertics < oldnettics;
        }
        uVar13 = maketic / ticdup & 3;
        frameskip[uVar13] = (uint)bVar26;
        auVar27._0_4_ = -(uint)(frameskip[0] == 0);
        auVar27._4_4_ = -(uint)(frameskip[1] == 0);
        auVar27._8_4_ = -(uint)(frameskip[2] == 0);
        auVar27._12_4_ = -(uint)(frameskip[3] == 0);
        iVar24 = movmskps(uVar13,auVar27);
        if ((iVar24 == 0) && (skiptics = 1, debugfile != (FILE *)0x0)) {
          fputc(0x2b,(FILE *)debugfile);
        }
        oldnettics = nettics[0];
        iVar24 = nettics[0];
        iVar2 = resendto[0];
      }
    }
  }
  resendto[0] = iVar2;
  nettics[0] = iVar24;
  return;
}

Assistant:

TicSpecial &operator << (float it)
	{
		if (streamptr)
		{
			CheckSpace (4);
			WriteFloat (it, &streamptr);
		}
		return *this;
	}